

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.c
# Opt level: O2

uint32_t hash_bitmap(ALLEGRO_BITMAP *bmp)

{
  uint uVar1;
  int iVar2;
  long *plVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar1 = al_get_bitmap_width();
  iVar2 = al_get_bitmap_height(bmp);
  plVar3 = (long *)al_lock_bitmap(bmp,0x19,1);
  uVar6 = 0;
  uVar7 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar7 = uVar6;
  }
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  uVar1 = 0x811c9dc5;
  while (iVar4 = (int)uVar6, iVar4 != iVar2) {
    lVar5 = *plVar3 + (long)(*(int *)((long)plVar3 + 0xc) * iVar4);
    for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      uVar1 = ((int)*(char *)(lVar5 + uVar6 * 4) ^
              ((int)*(char *)(lVar5 + 1 + uVar6 * 4) ^
              ((int)*(char *)(lVar5 + 2 + uVar6 * 4) ^
              (uVar1 ^ (int)*(char *)(lVar5 + 3 + uVar6 * 4)) * 0x1000193) * 0x1000193) * 0x1000193)
              * 0x1000193;
    }
    uVar6 = (ulong)(iVar4 + 1);
  }
  al_unlock_bitmap(bmp);
  return uVar1;
}

Assistant:

static uint32_t hash_bitmap(ALLEGRO_BITMAP *bmp)
{
   ALLEGRO_LOCKED_REGION *lr;
   int x, y, w, h;
   uint32_t hash;

   w = al_get_bitmap_width(bmp);
   h = al_get_bitmap_height(bmp);
   hash = FNV_OFFSET_BASIS;

   lr = al_lock_bitmap(bmp, ALLEGRO_PIXEL_FORMAT_ABGR_8888_LE,
      ALLEGRO_LOCK_READONLY);

   for (y = 0; y < h; y++) {
      /* Oops, I unintentially committed the first version of this with signed
       * chars and computing in BGRA order, so leave it like that so we don't
       * have to update a bunch of old hashes.
       */
      signed char const *data = ((signed char const *)lr->data) + y*lr->pitch;
      for (x = 0; x < w; x++) {
         hash ^= data[x*4 + 3]; hash *= FNV_PRIME;
         hash ^= data[x*4 + 2]; hash *= FNV_PRIME;
         hash ^= data[x*4 + 1]; hash *= FNV_PRIME;
         hash ^= data[x*4 + 0]; hash *= FNV_PRIME;
      }
   }

   al_unlock_bitmap(bmp);

   return hash;
}